

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance_test_image_function.cpp
# Opt level: O0

pair<double,_double>
Function_Template::template_ProjectionProfile
          (ProjectionProfileForm2 ProjectionProfile,string *namespaceName,uint32_t size)

{
  uint32_t uVar1;
  code *in_RDI;
  uint32_t i;
  TimerContainer timer;
  vector<unsigned_int,_std::allocator<unsigned_int>_> projection;
  Image image;
  Image *in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint uVar2;
  uint local_c4;
  undefined1 local_a0 [16];
  BaseTimerContainer *in_stack_ffffffffffffff70;
  undefined1 local_50 [56];
  code *local_18;
  pair<double,_double> local_10;
  
  local_18 = in_RDI;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffff24,in_stack_ffffffffffffff20),
             (uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff18,(uint8_t)((ulong)in_stack_ffffffffffffff10 >> 0x38)
             ,(uint8_t)((ulong)in_stack_ffffffffffffff10 >> 0x30));
  Test_Helper::uniformImage
            ((uint32_t)((ulong)in_stack_ffffffffffffff18 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x17434f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x174359);
  SetupFunction((string *)0x174366);
  Performance_Test::TimerContainer::TimerContainer((TimerContainer *)in_stack_ffffffffffffff10);
  local_c4 = 0;
  while( true ) {
    uVar2 = local_c4;
    uVar1 = Test_Helper::runCount();
    if (uVar1 <= uVar2) break;
    Performance_Test::TimerContainer::start((TimerContainer *)in_stack_ffffffffffffff10);
    (*local_18)(local_50,0,local_a0);
    Performance_Test::TimerContainer::stop
              ((TimerContainer *)CONCAT44(uVar2,in_stack_ffffffffffffff20));
    local_c4 = local_c4 + 1;
  }
  CleanupFunction((string *)0x17443e);
  local_10 = Performance_Test::BaseTimerContainer::mean(in_stack_ffffffffffffff70);
  Performance_Test::TimerContainer::~TimerContainer((TimerContainer *)0x174480);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(uVar2,in_stack_ffffffffffffff20));
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x174497);
  return local_10;
}

Assistant:

std::pair < double, double > template_ProjectionProfile( ProjectionProfileForm2 ProjectionProfile , const std::string & namespaceName, uint32_t size )
    {
        const PenguinV_Image::Image image = Performance_Test::uniformImage( size, size );
        std::vector < uint32_t > projection;

        TEST_FUNCTION_LOOP( ProjectionProfile( image, false, projection ), namespaceName )
    }